

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transaction.cpp
# Opt level: O0

void __thiscall Transaction::Transaction(Transaction *this,int i,int m_)

{
  value_type_conflict1 local_a8;
  int local_a4;
  undefined1 local_a0 [4];
  int j;
  set<int,_std::less<int>,_std::allocator<int>_> local_88;
  set<int,_std::less<int>,_std::allocator<int>_> local_58;
  int local_18;
  int local_14;
  int m__local;
  int i_local;
  Transaction *this_local;
  
  this->status = 's';
  this->m = m_;
  this->id = i;
  local_18 = m_;
  local_14 = i;
  _m__local = this;
  std::mutex::mutex(&this->t_status_mtx);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->writeSet);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->readSet);
  std::vector<int,_std::allocator<int>_>::vector(&this->local_write_store);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->start_time);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->end_time);
  memset(&local_58,0,0x30);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&local_58);
  std::set<int,_std::less<int>,_std::allocator<int>_>::operator=(&this->writeSet,&local_58);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_58);
  memset(&local_88,0,0x30);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&local_88);
  std::set<int,_std::less<int>,_std::allocator<int>_>::operator=(&this->readSet,&local_88);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_88);
  memset(local_a0,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_a0);
  std::vector<int,_std::allocator<int>_>::operator=
            (&this->local_write_store,(vector<int,_std::allocator<int>_> *)local_a0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a0);
  for (local_a4 = 0; local_a4 < this->m; local_a4 = local_a4 + 1) {
    local_a8 = -1;
    std::vector<int,_std::allocator<int>_>::push_back(&this->local_write_store,&local_a8);
  }
  return;
}

Assistant:

Transaction::Transaction(int i, int m_): id(i), m(m_), status('s') {
    writeSet = std::set<int>();
    readSet = std::set<int>();

    // initialize
    // Initially stores -1 for each item.
    local_write_store = std::vector<int>();
    for(int j=0; j<m; j++) local_write_store.push_back(-1);

}